

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O3

string_t duckdb::UncompressedStringStorage::ReadOverflowString
                   (ColumnSegment *segment,Vector *result,block_id_t block,int32_t offset)

{
  BlockManager *block_id;
  BlockManager *pBVar1;
  __uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_> _Var2;
  __node_base __n;
  undefined8 uVar3;
  undefined8 uVar4;
  BlockHandle *pBVar5;
  idx_t iVar6;
  idx_t iVar7;
  iterator iVar8;
  ulong uVar9;
  idx_t len;
  float *__src;
  int iVar10;
  data_ptr_t pdVar11;
  uint uVar12;
  Vector *vector;
  undefined1 auVar13 [8];
  Vector *pVVar14;
  ulong __n_00;
  bool bVar15;
  string_t sVar16;
  BufferHandle handle;
  BufferHandle target_handle;
  BufferHandle local_118;
  float local_100;
  float fStack_fc;
  undefined4 uStack_f8;
  undefined4 local_f4;
  optional_ptr<duckdb::FileBuffer,_true> local_f0;
  undefined1 local_e8 [4];
  float fStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  __node_base local_c8;
  Vector *local_c0;
  undefined1 local_b8 [8];
  float *local_b0;
  undefined1 local_a8 [64];
  key_type_conflict local_68;
  BufferHandle local_60;
  BufferHandle local_48;
  
  local_c0 = result;
  local_68 = block;
  pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  block_id = pBVar5->block_manager;
  pBVar1 = (BlockManager *)block_id->buffer_manager;
  local_118.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (segment->segment_state).
           super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
           .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_118);
  if (block < 0x4000000000000060) {
    local_a8._40_8_ =
         local_118.handle.internal.
         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8._24_8_ = block_id;
    UncompressedStringSegmentState::GetHandle
              ((UncompressedStringSegmentState *)local_a8,
               (BlockManager *)
               local_118.handle.internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (block_id_t)block_id);
    local_a8._16_8_ = pBVar1;
    (*pBVar1->_vptr_BlockManager[7])(&local_118,pBVar1,(UncompressedStringSegmentState *)local_a8);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_118.node);
    vector = (Vector *)(ulong)*(uint *)((local_118.node.ptr)->buffer + offset);
    BufferHandle::BufferHandle((BufferHandle *)&local_100);
    uVar3 = local_a8._24_8_;
    local_a8._56_8_ = local_a8._24_8_ + 0x78;
    iVar6 = optional_idx::GetIndex((optional_idx *)local_a8._56_8_);
    local_a8._48_8_ = uVar3 + 0x80;
    iVar7 = optional_idx::GetIndex((optional_idx *)local_a8._48_8_);
    pVVar14 = (Vector *)(iVar6 - iVar7);
    local_c8._M_nxt = (_Hash_node_base *)vector;
    if (vector < pVVar14) {
      _local_b8 = (anon_struct_16_3_d7536bce_for_pointer)
                  StringVector::EmptyString((StringVector *)local_c0,vector,len);
      pdVar11 = local_b8._8_8_;
      if (local_b8._0_4_ < 0xd) {
        pdVar11 = local_b8 + 4;
      }
    }
    else {
      (*(*(_func_int ***)local_a8._16_8_)[4])(local_e8,local_a8._16_8_,8,vector,1);
      BufferHandle::operator=((BufferHandle *)&local_100,(BufferHandle *)local_e8);
      BufferHandle::~BufferHandle((BufferHandle *)local_e8);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f0);
      pdVar11 = (local_f0.ptr)->buffer;
    }
    local_a8._32_8_ = pVVar14;
    if ((int)local_c8._M_nxt != 0) {
      iVar10 = offset + 4;
      uVar9 = (ulong)local_c8._M_nxt & 0xffffffff;
      while( true ) {
        iVar6 = optional_idx::GetIndex((optional_idx *)local_a8._56_8_);
        iVar7 = optional_idx::GetIndex((optional_idx *)local_a8._48_8_);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_118.node);
        __n_00 = (iVar6 - (iVar7 + (long)iVar10)) - 8;
        if (uVar9 < __n_00) {
          __n_00 = uVar9;
        }
        switchD_012b9b0d::default(pdVar11,(local_118.node.ptr)->buffer + iVar10,__n_00);
        uVar3 = local_a8._24_8_;
        uVar12 = (int)uVar9 - (int)__n_00;
        uVar9 = (ulong)uVar12;
        if (uVar12 == 0) break;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_118.node);
        UncompressedStringSegmentState::GetHandle
                  ((UncompressedStringSegmentState *)local_e8,(BlockManager *)local_a8._40_8_,uVar3)
        ;
        uVar4 = local_a8._16_8_;
        uVar3 = local_a8._8_8_;
        local_a8._0_8_ = CONCAT44(fStack_e4,local_e8);
        _Var2._M_t.
        super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
        super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl._4_4_ = uStack_dc;
        _Var2._M_t.
        super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
        super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl._0_4_ = uStack_e0;
        local_e8 = (undefined1  [4])0x0;
        fStack_e4 = 0.0;
        uStack_e0 = 0;
        uStack_dc = 0;
        bVar15 = (__uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>)
                 local_a8._8_8_ !=
                 (__uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>)
                 0x0;
        local_a8._8_8_ =
             _Var2._M_t.
             super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>
             .super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl;
        if (bVar15) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_dc,uStack_e0) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_dc,uStack_e0)
                      );
          }
        }
        (*(*(_func_int ***)uVar4)[7])((UncompressedStringSegmentState *)local_e8,uVar4,local_a8);
        pdVar11 = pdVar11 + __n_00;
        BufferHandle::operator=(&local_118,(BufferHandle *)local_e8);
        BufferHandle::~BufferHandle((BufferHandle *)local_e8);
        iVar10 = 0;
      }
    }
    __n._M_nxt = local_c8._M_nxt;
    if (local_c8._M_nxt < (ulong)local_a8._32_8_) {
      uVar9 = (ulong)(uint)local_b8._0_4_;
      if (uVar9 < 0xd) {
        switchD_012e3010::default(local_b8 + uVar9 + 4,0,0xc - uVar9);
        __src = local_b0;
      }
      else {
        local_b8._4_4_ = *local_b0;
        __src = local_b0;
      }
      auVar13 = local_b8;
    }
    else {
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f0);
      __src = (float *)(local_f0.ptr)->buffer;
      BufferHandle::BufferHandle(&local_48,(BufferHandle *)&local_100);
      StringVector::AddHandle(local_c0,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      local_e8 = SUB84(__n._M_nxt,0);
      if ((uint)local_e8 < 0xd) {
        uStack_dc = 0;
        fStack_e4 = 0.0;
        uStack_e0 = 0;
        if (local_e8 == (undefined1  [4])0x0) {
          __src = (float *)0x0;
        }
        else {
          switchD_012b9b0d::default(&fStack_e4,__src,(size_t)__n._M_nxt);
          __src = (float *)CONCAT44(uStack_dc,uStack_e0);
        }
      }
      else {
        fStack_e4 = *__src;
      }
      auVar13._4_4_ = fStack_e4;
      auVar13._0_4_ = (float)local_e8;
    }
    BufferHandle::~BufferHandle((BufferHandle *)&local_100);
    BufferHandle::~BufferHandle(&local_118);
    if ((StringBlock *)local_a8._8_8_ != (StringBlock *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
  }
  else {
    iVar8 = ::std::
            _Hashtable<long,_std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>,_std::allocator<std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<long,_std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>,_std::allocator<std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&(local_118.handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->block_manager,&local_68);
    (*pBVar1->_vptr_BlockManager[7])
              (&local_118,pBVar1,
               *(undefined8 *)
                ((long)iVar8.
                       super__Node_iterator_base<std::pair<const_long,_std::reference_wrapper<duckdb::StringBlock>_>,_false>
                       ._M_cur + 0x10));
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_118.node);
    pdVar11 = (local_118.node.ptr)->buffer;
    BufferHandle::BufferHandle(&local_60,&local_118);
    StringVector::AddHandle(local_c0,&local_60);
    BufferHandle::~BufferHandle(&local_60);
    __src = (float *)((long)(pdVar11 + offset) + 4);
    local_100 = *(float *)(pdVar11 + offset);
    uVar9 = (ulong)(uint)local_100;
    if (uVar9 < 0xd) {
      local_f4 = 0;
      fStack_fc = 0.0;
      uStack_f8 = 0;
      if (uVar9 == 0) {
        __src = (float *)0x0;
      }
      else {
        switchD_012b9b0d::default(&fStack_fc,__src,uVar9);
        __src = (float *)CONCAT44(local_f4,uStack_f8);
      }
    }
    else {
      fStack_fc = *__src;
    }
    auVar13._4_4_ = fStack_fc;
    auVar13._0_4_ = local_100;
    BufferHandle::~BufferHandle(&local_118);
  }
  sVar16.value.pointer.ptr = (char *)__src;
  sVar16.value._0_8_ = auVar13;
  return (string_t)sVar16.value;
}

Assistant:

string_t UncompressedStringStorage::ReadOverflowString(ColumnSegment &segment, Vector &result, block_id_t block,
                                                       int32_t offset) {
	auto &block_manager = segment.GetBlockManager();
	auto &buffer_manager = block_manager.buffer_manager;
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();

	D_ASSERT(block != INVALID_BLOCK);
	D_ASSERT(offset < NumericCast<int32_t>(block_manager.GetBlockSize()));

	if (block < MAXIMUM_BLOCK) {
		// read the overflow string from disk
		// pin the initial handle and read the length
		auto block_handle = state.GetHandle(block_manager, block);
		auto handle = buffer_manager.Pin(block_handle);

		// read header
		uint32_t length = Load<uint32_t>(handle.Ptr() + offset);
		uint32_t remaining = length;
		offset += sizeof(uint32_t);

		BufferHandle target_handle;
		string_t overflow_string;
		data_ptr_t target_ptr;
		bool allocate_block = length >= block_manager.GetBlockSize();
		if (allocate_block) {
			// overflow string is bigger than a block - allocate a temporary buffer for it
			target_handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, length);
			target_ptr = target_handle.Ptr();
		} else {
			// overflow string is smaller than a block - add it to the vector directly
			overflow_string = StringVector::EmptyString(result, length);
			target_ptr = data_ptr_cast(overflow_string.GetDataWriteable());
		}

		// now append the string to the single buffer
		while (remaining > 0) {
			idx_t to_write = MinValue<idx_t>(remaining, block_manager.GetBlockSize() - sizeof(block_id_t) -
			                                                UnsafeNumericCast<idx_t>(offset));
			memcpy(target_ptr, handle.Ptr() + offset, to_write);
			remaining -= to_write;
			offset += UnsafeNumericCast<int32_t>(to_write);
			target_ptr += to_write;
			if (remaining > 0) {
				// read the next block
				block_id_t next_block = Load<block_id_t>(handle.Ptr() + offset);
				block_handle = state.GetHandle(block_manager, next_block);
				handle = buffer_manager.Pin(block_handle);
				offset = 0;
			}
		}
		if (allocate_block) {
			auto final_buffer = target_handle.Ptr();
			StringVector::AddHandle(result, std::move(target_handle));
			return ReadString(final_buffer, 0, length);
		} else {
			overflow_string.Finalize();
			return overflow_string;
		}
	}

	// read the overflow string from memory
	// first pin the handle, if it is not pinned yet
	auto entry = state.overflow_blocks.find(block);
	D_ASSERT(entry != state.overflow_blocks.end());
	auto handle = buffer_manager.Pin(entry->second.get().block);
	auto final_buffer = handle.Ptr();
	StringVector::AddHandle(result, std::move(handle));
	return ReadStringWithLength(final_buffer, offset);
}